

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O3

void __thiscall Client::handleGetNNewPostsRequest(Client *this,GetNNewPostsRequest request)

{
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *val;
  value_t vVar1;
  pointer pcVar2;
  json_value jVar3;
  CommunicationStack *pCVar4;
  uint __val;
  uint uVar5;
  reference pvVar6;
  ulong uVar7;
  uint uVar8;
  pointer pPVar9;
  uint __len;
  Event EVar10;
  Post post;
  json j_array;
  string __str;
  json j_post;
  pointer local_148;
  undefined1 auStack_140 [8];
  json_value local_138;
  undefined1 local_130 [32];
  json_value local_110;
  undefined1 local_108 [8];
  json_value local_100;
  vector<Post,_std::allocator<Post>_> local_f8;
  Client *local_e0;
  undefined1 local_d8 [8];
  json_value local_d0;
  undefined1 local_c8 [32];
  undefined1 local_a8 [16];
  undefined1 local_98 [24];
  json_value local_80;
  GetNNewPostsResponse local_78 [2];
  undefined1 local_40 [16];
  
  if (this->user == (User *)0x0) {
    pCVar4 = this->communicationStack;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json<const_char_(&)[1],_char[1],_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_40,(char (*) [1])0x1a5672);
    GetNNewPostsResponse::GetNNewPostsResponse
              ((GetNNewPostsResponse *)&local_148,false,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_40);
    EVar10 = GetNNewPostsResponse::operator_cast_to_basic_json(local_78);
    (*(pCVar4->super_IONotifiable)._vptr_IONotifiable[3])(pCVar4,local_78,EVar10.m_value.object);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_78);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)&local_78[0].data,local_78[0].status);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)auStack_140);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(auStack_140 + 8),auStack_140[0]);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_40);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_40 + 8),local_40[0]);
  }
  else {
    local_f8.super__Vector_base<Post,_std::allocator<Post>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_f8.super__Vector_base<Post,_std::allocator<Post>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_f8.super__Vector_base<Post,_std::allocator<Post>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_e0 = this;
    Database::getNNewestPosts
              ((vector<Post,_std::allocator<Post>_> *)local_c8,&server.database,
               request.numberOfPosts);
    local_138 = (json_value)
                local_f8.super__Vector_base<Post,_std::allocator<Post>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    auStack_140 = (undefined1  [8])
                  local_f8.super__Vector_base<Post,_std::allocator<Post>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    local_148 = local_f8.super__Vector_base<Post,_std::allocator<Post>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_f8.super__Vector_base<Post,_std::allocator<Post>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)local_c8._16_8_;
    local_f8.super__Vector_base<Post,_std::allocator<Post>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_c8._0_8_;
    local_f8.super__Vector_base<Post,_std::allocator<Post>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)local_c8._8_8_;
    local_c8._0_8_ = (pointer)0x0;
    local_c8._8_8_ = (pointer)0x0;
    local_c8._16_8_ = (pointer)0x0;
    std::vector<Post,_std::allocator<Post>_>::~vector
              ((vector<Post,_std::allocator<Post>_> *)&local_148);
    std::vector<Post,_std::allocator<Post>_>::~vector
              ((vector<Post,_std::allocator<Post>_> *)local_c8);
    local_d8[0] = null;
    local_d0.object = (object_t *)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_d8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_d8);
    local_98[0x10] = false;
    local_80.object = (object_t *)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)(local_98 + 0x10));
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)(local_98 + 0x10));
    local_78[0].data.m_value.object =
         (object_t *)
         local_f8.super__Vector_base<Post,_std::allocator<Post>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    if (local_f8.super__Vector_base<Post,_std::allocator<Post>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_f8.super__Vector_base<Post,_std::allocator<Post>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      pPVar9 = local_f8.super__Vector_base<Post,_std::allocator<Post>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        auStack_140 = (undefined1  [8])(auStack_140 + 0x10);
        local_148 = *(pointer *)pPVar9;
        pcVar2 = (pPVar9->content)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)auStack_140,pcVar2,pcVar2 + (pPVar9->content)._M_string_length);
        __val = -(uint)local_148;
        if (0 < (int)(uint)local_148) {
          __val = (uint)local_148;
        }
        __len = 1;
        if (9 < __val) {
          uVar7 = (ulong)__val;
          uVar8 = 4;
          do {
            __len = uVar8;
            uVar5 = (uint)uVar7;
            if (uVar5 < 100) {
              __len = __len - 2;
              goto LAB_001117e5;
            }
            if (uVar5 < 1000) {
              __len = __len - 1;
              goto LAB_001117e5;
            }
            if (uVar5 < 10000) goto LAB_001117e5;
            uVar7 = uVar7 / 10000;
            uVar8 = __len + 4;
          } while (99999 < uVar5);
          __len = __len + 1;
        }
LAB_001117e5:
        uVar8 = (uint)local_148 >> 0x1f;
        local_c8._0_8_ = local_c8 + 0x10;
        std::__cxx11::string::_M_construct
                  ((ulong)local_c8,(char)__len - ((char)((ulong)local_148 >> 0x18) >> 7));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)(local_c8._0_8_ + (ulong)uVar8),__len,__val);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)(local_130 + 0x18),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
        val = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               *)(local_98 + 0x10);
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)val,"id");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)(local_130 + 0x18));
        vVar1 = pvVar6->m_type;
        pvVar6->m_type = local_130[0x18];
        jVar3 = pvVar6->m_value;
        pvVar6->m_value = local_110;
        local_130[0x18] = vVar1;
        local_110 = jVar3;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant(pvVar6);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)(local_130 + 0x18));
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)(local_130 + 0x20),local_130[0x18]);
        if ((pointer)local_c8._0_8_ != (pointer)(local_c8 + 0x10)) {
          operator_delete((void *)local_c8._0_8_);
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_140)
        ;
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)val,"content");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_108);
        vVar1 = pvVar6->m_type;
        pvVar6->m_type = local_108[0];
        jVar3 = pvVar6->m_value;
        pvVar6->m_value = local_100;
        local_108[0] = vVar1;
        local_100 = jVar3;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant(pvVar6);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_108);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)(local_108 + 8),local_108[0]);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)local_d8,val);
        if (auStack_140 != (undefined1  [8])(auStack_140 + 0x10)) {
          operator_delete((void *)auStack_140);
        }
        pPVar9 = pPVar9 + 1;
      } while (pPVar9 != (pointer)local_78[0].data.m_value.object);
    }
    pCVar4 = local_e0->communicationStack;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_a8,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_d8);
    GetNNewPostsResponse::GetNNewPostsResponse
              ((GetNNewPostsResponse *)&local_148,true,(json *)local_a8);
    EVar10 = GetNNewPostsResponse::operator_cast_to_basic_json((GetNNewPostsResponse *)local_98);
    (*(pCVar4->super_IONotifiable)._vptr_IONotifiable[3])(pCVar4,local_98,EVar10.m_value.object);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_98);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_98 + 8),local_98[0]);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)auStack_140);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(auStack_140 + 8),auStack_140[0]);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_a8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_a8 + 8),local_a8[0]);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)(local_98 + 0x10));
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)&local_80.boolean,local_98[0x10]);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_d8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_d8 + 8),local_d8[0]);
    std::vector<Post,_std::allocator<Post>_>::~vector(&local_f8);
  }
  return;
}

Assistant:

void Client::handleGetNNewPostsRequest(GetNNewPostsRequest request)
{
	if(user == nullptr)
	{
		communicationStack->sendEvent(GetNNewPostsResponse(false, ""));
		return;
	}

	std::vector<Post> posts;

	try
	{
		posts = server.database.getNNewestPosts(request.numberOfPosts);
	}
	catch (DatabaseException& e)
	{
		std::cout << e.what() << std::endl;
		communicationStack->sendEvent(GetNNewPostsResponse(false, ""));
		return;
	}

	json j_array;
	json j_post;

	for(auto post: posts)
	{
		j_post["id"] = std::to_string(post.getId());
		j_post["content"] = post.getContent();
		j_array.push_back(j_post);
	}

	communicationStack->sendEvent(GetNNewPostsResponse(true, j_array));
}